

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_update_inter_mode_stats
               (FRAME_CONTEXT *fc,FRAME_COUNTS *counts,PREDICTION_MODE mode,int16_t mode_context)

{
  undefined7 in_register_00000011;
  aom_cdf_prob (*cdf) [3];
  bool val;
  
  cdf = fc->newmv_cdf + ((ushort)mode_context & 7);
  if ((int)CONCAT71(in_register_00000011,mode) != 0x10) {
    update_cdf(*cdf,'\x01',2);
    cdf = fc->zeromv_cdf + (((ushort)mode_context & 8) >> 3);
    if (mode != '\x0f') {
      update_cdf(*cdf,'\x01',2);
      cdf = fc->refmv_cdf + (((ushort)mode_context & 0xf0) >> 4);
      val = mode != '\r';
      goto LAB_0019d0c6;
    }
  }
  val = false;
LAB_0019d0c6:
  update_cdf(*cdf,val,2);
  return;
}

Assistant:

void av1_update_inter_mode_stats(FRAME_CONTEXT *fc, FRAME_COUNTS *counts,
                                 PREDICTION_MODE mode, int16_t mode_context) {
  (void)counts;

  int16_t mode_ctx = mode_context & NEWMV_CTX_MASK;
  if (mode == NEWMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->newmv_mode[mode_ctx][0];
#endif
    update_cdf(fc->newmv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->newmv_mode[mode_ctx][1];
#endif
  update_cdf(fc->newmv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;
  if (mode == GLOBALMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->zeromv_mode[mode_ctx][0];
#endif
    update_cdf(fc->zeromv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->zeromv_mode[mode_ctx][1];
#endif
  update_cdf(fc->zeromv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> REFMV_OFFSET) & REFMV_CTX_MASK;
#if CONFIG_ENTROPY_STATS
  ++counts->refmv_mode[mode_ctx][mode != NEARESTMV];
#endif
  update_cdf(fc->refmv_cdf[mode_ctx], mode != NEARESTMV, 2);
}